

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_AABBTree.cpp
# Opt level: O0

bool __thiscall Opcode::AABBTree::Build(AABBTree *this,AABBTreeBuilder *builder)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  udword *puVar3;
  ulong uVar4;
  ulong *puVar5;
  AABBTreeNode *pAVar6;
  ulong uVar7;
  AABBTreeNode *local_90;
  uint local_4c;
  udword i;
  AABBTreeBuilder *builder_local;
  AABBTree *this_local;
  
  if ((builder == (AABBTreeBuilder *)0x0) || (builder->mNbPrimitives == 0)) {
    this_local._7_1_ = false;
  }
  else {
    Release(this);
    builder->mCount = 1;
    builder->mNbInvalidSplits = 0;
    auVar1 = ZEXT416(builder->mNbPrimitives) * ZEXT816(4);
    uVar2 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    puVar3 = (udword *)operator_new__(uVar2);
    this->mIndices = puVar3;
    if (this->mIndices == (udword *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      for (local_4c = 0; local_4c < builder->mNbPrimitives; local_4c = local_4c + 1) {
        this->mIndices[local_4c] = local_4c;
      }
      (this->super_AABBTreeNode).mNodePrimitives = this->mIndices;
      (this->super_AABBTreeNode).mNbPrimitives = builder->mNbPrimitives;
      if ((builder->mSettings).mLimit == 1) {
        uVar2 = CONCAT44(0,builder->mNbPrimitives * 2 - 1);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar2;
        uVar4 = SUB168(auVar1 * ZEXT816(0x30),0);
        uVar7 = uVar4 + 8;
        if (SUB168(auVar1 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar4) {
          uVar7 = 0xffffffffffffffff;
        }
        puVar5 = (ulong *)operator_new__(uVar7);
        *puVar5 = uVar2;
        pAVar6 = (AABBTreeNode *)(puVar5 + 1);
        if (uVar2 != 0) {
          local_90 = pAVar6;
          do {
            AABBTreeNode::AABBTreeNode(local_90);
            local_90 = local_90 + 1;
          } while (local_90 != pAVar6 + uVar2);
        }
        this->mPool = pAVar6;
        builder->mNodeBase = this->mPool;
      }
      AABBTreeNode::_BuildHierarchy(&this->super_AABBTreeNode,builder);
      this->mTotalNbNodes = builder->mCount;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AABBTree::Build(AABBTreeBuilder* builder)
{
	// Checkings
	if(!builder || !builder->mNbPrimitives)	return false;

	// Release previous tree
	Release();

	// Init stats
	builder->SetCount(1);
	builder->SetNbInvalidSplits(0);

	// Initialize indices. This list will be modified during build.
	mIndices = new udword[builder->mNbPrimitives];
	CHECKALLOC(mIndices);
	// Identity permutation
	for(udword i=0;i<builder->mNbPrimitives;i++)	mIndices[i] = i;

	// Setup initial node. Here we have a complete permutation of the app's primitives.
	mNodePrimitives	= mIndices;
	mNbPrimitives	= builder->mNbPrimitives;

	// Use a linear array for complete trees (since we can predict the final number of nodes) [Opcode 1.3]
//	if(builder->mRules&SPLIT_COMPLETE)
	if(builder->mSettings.mLimit==1)
	{
		// Allocate a pool of nodes
		mPool = new AABBTreeNode[builder->mNbPrimitives*2 - 1];

		builder->mNodeBase = mPool;	// ### ugly !
	}

	// Build the hierarchy
	_BuildHierarchy(builder);

	// Get back total number of nodes
	mTotalNbNodes	= builder->GetCount();

	// For complete trees, check the correct number of nodes has been created [Opcode 1.3]
	if(mPool)	ASSERT(mTotalNbNodes==builder->mNbPrimitives*2 - 1);

	return true;
}